

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opt-test.cpp
# Opt level: O1

int main(void)

{
  undefined8 uVar1;
  long lVar2;
  undefined1 *puVar3;
  thread this;
  FOCC_CTA *this_00;
  time_t tVar4;
  istream *piVar5;
  ostream *poVar6;
  FOCC_OTA *pFVar7;
  id this_01;
  BOCC_CTA *this_02;
  unsigned_long *puVar8;
  ulong uVar9;
  int iVar10;
  long lVar11;
  undefined1 auVar12 [16];
  double dVar18;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 *puStack_290;
  undefined1 auStack_288 [8];
  long local_280;
  ifstream inFile;
  byte abStack_260 [488];
  undefined1 *local_78;
  thread local_70;
  int local_64;
  undefined1 *local_60;
  undefined1 local_58 [16];
  thread local_40;
  FOCC_CTA *foccCta;
  BOCC_CTA *boccCta;
  
  puStack_290 = (undefined1 *)0x1026a7;
  tVar4 = time((time_t *)0x0);
  puStack_290 = (undefined1 *)0x1026ae;
  srand((uint)tVar4);
  puStack_290 = (undefined1 *)0x1026c9;
  std::ifstream::ifstream(&local_280,"inp-params.txt",_S_in);
  if ((abStack_260[*(long *)(local_280 + -0x18)] & 5) != 0) {
    puStack_290 = (undefined1 *)0x10318a;
    std::operator<<((ostream *)&std::cerr,"inp-params.txt NOT FOUND!\n");
    puStack_290 = &LAB_00103194;
    exit(1);
  }
  puStack_290 = (undefined1 *)0x1026f1;
  piVar5 = (istream *)std::istream::operator>>((istream *)&local_280,(int *)&glb::N);
  puStack_290 = (undefined1 *)0x102700;
  piVar5 = (istream *)std::istream::operator>>(piVar5,&glb::M);
  puStack_290 = (undefined1 *)0x10270f;
  piVar5 = (istream *)std::istream::operator>>(piVar5,&glb::numTrans);
  puStack_290 = (undefined1 *)0x10271e;
  piVar5 = (istream *)std::istream::operator>>(piVar5,&glb::constVal);
  puStack_290 = (undefined1 *)0x10272d;
  std::istream::operator>>(piVar5,&glb::lambda);
  if (0 < (int)glb::N) {
    iVar10 = 0;
    do {
      local_40._M_id._M_thread = (id)0;
      if (DAT_0010c208._M_current == DAT_0010c210) {
        puStack_290 = (undefined1 *)0x102786;
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_realloc_insert<unsigned_long>
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&glb::total_aborts,
                   DAT_0010c208,(unsigned_long *)&local_40);
      }
      else {
        *DAT_0010c208._M_current = 0;
        DAT_0010c208._M_current = DAT_0010c208._M_current + 1;
      }
      local_40._M_id._M_thread = (id)0;
      if (DAT_0010c220._M_current == DAT_0010c228) {
        puStack_290 = (undefined1 *)0x1027bd;
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_realloc_insert<unsigned_long>
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&glb::total_delay,
                   DAT_0010c220,(unsigned_long *)&local_40);
      }
      else {
        *DAT_0010c220._M_current = 0;
        DAT_0010c220._M_current = DAT_0010c220._M_current + 1;
      }
      iVar10 = iVar10 + 1;
    } while (iVar10 < (int)glb::N);
  }
  puStack_290 = (undefined1 *)0x1027e1;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Input Params: N=",0x10);
  puStack_290 = (undefined1 *)0x1027f3;
  poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,glb::N);
  puStack_290 = (undefined1 *)0x10280a;
  std::__ostream_insert<char,std::char_traits<char>>(poVar6," M = ",5);
  puStack_290 = (undefined1 *)0x102818;
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,glb::M);
  puStack_290 = (undefined1 *)0x10282f;
  std::__ostream_insert<char,std::char_traits<char>>(poVar6," numTrans = ",0xc);
  puStack_290 = (undefined1 *)0x10283d;
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,glb::numTrans);
  puStack_290 = (undefined1 *)0x102851;
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
  glb::dist = (double)glb::lambda;
  puStack_290 = (undefined1 *)0x102879;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"***** FOCC OTA ******\n",0x16);
  puStack_290 = (undefined1 *)0x102883;
  pFVar7 = (FOCC_OTA *)operator_new(0x90);
  puStack_290 = (undefined1 *)0x102894;
  FOCC_OTA::FOCC_OTA(pFVar7,glb::M);
  uVar9 = (ulong)glb::N;
  lVar2 = -(uVar9 * 8 + 0xf & 0xfffffffffffffff0);
  local_60 = auStack_288 + lVar2;
  glb::foccOta = pFVar7;
  local_78 = auStack_288;
  if (uVar9 != 0) {
    local_78 = auStack_288;
    *(undefined8 *)(auStack_288 + lVar2 + -8) = 0x1028d1;
    memset(local_60,0,uVar9 * 8);
  }
  *(undefined8 *)(auStack_288 + lVar2 + -8) = 0x1028e8;
  glb::log_file = fopen("FOCC-OTA-log.txt","w");
  foccCta = (FOCC_CTA *)((ulong)foccCta._4_4_ << 0x20);
  if (0 < (int)glb::N) {
    do {
      *(undefined8 *)(auStack_288 + lVar2 + -8) = 0x102926;
      std::thread::thread<void(&)(FOCC_OTA*,int),FOCC_OTA*&,int&,void>
                (&local_40,updtMem,&glb::foccOta,(int *)&foccCta);
      if (*(long *)(local_60 + (long)(int)foccCta * 8) != 0) goto LAB_00103215;
      ((id *)(local_60 + (long)(int)foccCta * 8))->_M_thread =
           (native_handle_type)local_40._M_id._M_thread;
      iVar10 = (int)foccCta + 1;
      foccCta = (FOCC_CTA *)CONCAT44(foccCta._4_4_,iVar10);
    } while (iVar10 < (int)glb::N);
  }
  if (0 < (int)glb::N) {
    lVar11 = 0;
    do {
      *(undefined8 *)(auStack_288 + lVar2 + -8) = 0x102966;
      std::thread::join();
      lVar11 = lVar11 + 1;
    } while (lVar11 < (int)glb::N);
  }
  pFVar7 = glb::foccOta;
  if (glb::foccOta != (FOCC_OTA *)0x0) {
    *(undefined8 *)(auStack_288 + lVar2 + -8) = 0x10298d;
    FOCC_OTA::~FOCC_OTA(glb::foccOta);
    *(undefined8 *)(auStack_288 + lVar2 + -8) = 0x10299a;
    operator_delete(pFVar7,0x90);
  }
  if (glb::total_delay == DAT_0010c220._M_current) {
    local_58 = ZEXT816(0);
  }
  else {
    lVar11 = 0;
    puVar8 = glb::total_delay;
    do {
      lVar11 = lVar11 + *puVar8;
      puVar8 = puVar8 + 1;
    } while (puVar8 != DAT_0010c220._M_current);
    auVar12._8_4_ = (int)((ulong)lVar11 >> 0x20);
    auVar12._0_8_ = lVar11;
    auVar12._12_4_ = 0x45300000;
    dVar18 = auVar12._8_8_ - 1.9342813113834067e+25;
    local_58._8_4_ = SUB84(dVar18,0);
    local_58._0_8_ = dVar18 + ((double)CONCAT44(0x43300000,(int)lVar11) - 4503599627370496.0);
    local_58._12_4_ = (int)((ulong)dVar18 >> 0x20);
  }
  *(undefined8 *)(auStack_288 + lVar2 + -8) = 0x102a04;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Avg Delay:",10);
  dVar18 = (double)local_58._0_8_ / (double)(int)(glb::numTrans * glb::N);
  *(undefined8 *)(auStack_288 + lVar2 + -8) = 0x102a2d;
  poVar6 = std::ostream::_M_insert<double>(dVar18);
  uVar1 = *(undefined8 *)(*(long *)poVar6 + -0x18);
  *(undefined8 *)(auStack_288 + lVar2 + -8) = 0x102a44;
  std::ios::widen((char)uVar1 + (char)poVar6);
  *(undefined8 *)(auStack_288 + lVar2 + -8) = 0x102a4f;
  std::ostream::put((char)poVar6);
  *(undefined8 *)(auStack_288 + lVar2 + -8) = 0x102a57;
  std::ostream::flush();
  if (glb::total_aborts == DAT_0010c208._M_current) {
    local_58 = ZEXT816(0);
  }
  else {
    lVar11 = 0;
    puVar8 = glb::total_aborts;
    do {
      lVar11 = lVar11 + *puVar8;
      puVar8 = puVar8 + 1;
    } while (puVar8 != DAT_0010c208._M_current);
    auVar13._8_4_ = (int)((ulong)lVar11 >> 0x20);
    auVar13._0_8_ = lVar11;
    auVar13._12_4_ = 0x45300000;
    dVar18 = auVar13._8_8_ - 1.9342813113834067e+25;
    local_58._8_4_ = SUB84(dVar18,0);
    local_58._0_8_ = dVar18 + ((double)CONCAT44(0x43300000,(int)lVar11) - 4503599627370496.0);
    local_58._12_4_ = (int)((ulong)dVar18 >> 0x20);
  }
  *(undefined8 *)(auStack_288 + lVar2 + -8) = 0x102ac1;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Avg Aborts:",0xb);
  dVar18 = (double)local_58._0_8_ / (double)(int)(glb::numTrans * glb::N);
  *(undefined8 *)(auStack_288 + lVar2 + -8) = 0x102aea;
  poVar6 = std::ostream::_M_insert<double>(dVar18);
  uVar1 = *(undefined8 *)(*(long *)poVar6 + -0x18);
  *(undefined8 *)(auStack_288 + lVar2 + -8) = 0x102b01;
  std::ios::widen((char)uVar1 + (char)poVar6);
  *(undefined8 *)(auStack_288 + lVar2 + -8) = 0x102b0c;
  std::ostream::put((char)poVar6);
  *(undefined8 *)(auStack_288 + lVar2 + -8) = 0x102b14;
  std::ostream::flush();
  *(undefined8 *)(auStack_288 + lVar2 + -8) = 0x102b20;
  fclose(glb::log_file);
  if (0 < (int)glb::N) {
    iVar10 = 0;
    do {
      local_40._M_id._M_thread = (id)0;
      if (DAT_0010c208._M_current == DAT_0010c210) {
        *(undefined8 *)(auStack_288 + lVar2 + -8) = 0x102b79;
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_realloc_insert<unsigned_long>
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&glb::total_aborts,
                   DAT_0010c208,(unsigned_long *)&local_40);
      }
      else {
        *DAT_0010c208._M_current = 0;
        DAT_0010c208._M_current = DAT_0010c208._M_current + 1;
      }
      local_40._M_id._M_thread = (id)0;
      if (DAT_0010c220._M_current == DAT_0010c228) {
        *(undefined8 *)(auStack_288 + lVar2 + -8) = 0x102bb0;
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_realloc_insert<unsigned_long>
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&glb::total_delay,
                   DAT_0010c220,(unsigned_long *)&local_40);
      }
      else {
        *DAT_0010c220._M_current = 0;
        DAT_0010c220._M_current = DAT_0010c220._M_current + 1;
      }
      iVar10 = iVar10 + 1;
    } while (iVar10 < (int)glb::N);
  }
  *(undefined8 *)(auStack_288 + lVar2 + -8) = 0x102bd4;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"\n***** FOCC CTA ******\n",0x17);
  *(undefined8 *)(auStack_288 + lVar2 + -8) = 0x102bde;
  this_01._M_thread = (native_handle_type)operator_new(0x90);
  *(undefined8 *)(auStack_288 + lVar2 + -8) = 0x102bef;
  FOCC_CTA::FOCC_CTA((FOCC_CTA *)this_01._M_thread,glb::M);
  local_40._M_id._M_thread = (id)(id)this_01._M_thread;
  *(undefined8 *)(auStack_288 + lVar2 + -8) = 0x102c06;
  glb::log_file = fopen("FOCC-CTA-log.txt","w");
  local_70._M_id._M_thread._0_4_ = 0;
  if (0 < (int)glb::N) {
    do {
      *(undefined8 *)(auStack_288 + lVar2 + -8) = 0x102c41;
      std::thread::thread<void(&)(FOCC_CTA*,int),FOCC_CTA*&,int&,void>
                ((thread *)&foccCta,updtMem2,(FOCC_CTA **)&local_40,(int *)&local_70);
      if (*(long *)(local_60 + (long)(int)local_70._M_id._M_thread * 8) != 0) goto LAB_00103215;
      *(FOCC_CTA **)(local_60 + (long)(int)local_70._M_id._M_thread * 8) = foccCta;
      local_70._M_id._M_thread._0_4_ = (int)local_70._M_id._M_thread + 1;
    } while ((int)local_70._M_id._M_thread < (int)glb::N);
  }
  if (0 < (int)glb::N) {
    lVar11 = 0;
    do {
      *(undefined8 *)(auStack_288 + lVar2 + -8) = 0x102c81;
      std::thread::join();
      lVar11 = lVar11 + 1;
    } while (lVar11 < (int)glb::N);
  }
  this._M_id._M_thread = local_40._M_id._M_thread;
  if (local_40._M_id._M_thread != 0) {
    *(undefined8 *)(auStack_288 + lVar2 + -8) = 0x102ca5;
    FOCC_CTA::~FOCC_CTA((FOCC_CTA *)this._M_id._M_thread);
    *(undefined8 *)(auStack_288 + lVar2 + -8) = 0x102cb2;
    operator_delete((void *)this._M_id._M_thread,0x90);
  }
  if (glb::total_delay == DAT_0010c220._M_current) {
    local_58 = ZEXT816(0);
  }
  else {
    lVar11 = 0;
    puVar8 = glb::total_delay;
    do {
      lVar11 = lVar11 + *puVar8;
      puVar8 = puVar8 + 1;
    } while (puVar8 != DAT_0010c220._M_current);
    auVar14._8_4_ = (int)((ulong)lVar11 >> 0x20);
    auVar14._0_8_ = lVar11;
    auVar14._12_4_ = 0x45300000;
    dVar18 = auVar14._8_8_ - 1.9342813113834067e+25;
    local_58._8_4_ = SUB84(dVar18,0);
    local_58._0_8_ = dVar18 + ((double)CONCAT44(0x43300000,(int)lVar11) - 4503599627370496.0);
    local_58._12_4_ = (int)((ulong)dVar18 >> 0x20);
  }
  *(undefined8 *)(auStack_288 + lVar2 + -8) = 0x102d1c;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Avg Delay:",10);
  dVar18 = (double)local_58._0_8_ / (double)(int)(glb::numTrans * glb::N);
  *(undefined8 *)(auStack_288 + lVar2 + -8) = 0x102d45;
  poVar6 = std::ostream::_M_insert<double>(dVar18);
  uVar1 = *(undefined8 *)(*(long *)poVar6 + -0x18);
  *(undefined8 *)(auStack_288 + lVar2 + -8) = 0x102d5c;
  std::ios::widen((char)uVar1 + (char)poVar6);
  *(undefined8 *)(auStack_288 + lVar2 + -8) = 0x102d67;
  std::ostream::put((char)poVar6);
  *(undefined8 *)(auStack_288 + lVar2 + -8) = 0x102d6f;
  std::ostream::flush();
  if (glb::total_aborts == DAT_0010c208._M_current) {
    local_58 = ZEXT816(0);
  }
  else {
    lVar11 = 0;
    puVar8 = glb::total_aborts;
    do {
      lVar11 = lVar11 + *puVar8;
      puVar8 = puVar8 + 1;
    } while (puVar8 != DAT_0010c208._M_current);
    auVar15._8_4_ = (int)((ulong)lVar11 >> 0x20);
    auVar15._0_8_ = lVar11;
    auVar15._12_4_ = 0x45300000;
    dVar18 = auVar15._8_8_ - 1.9342813113834067e+25;
    local_58._8_4_ = SUB84(dVar18,0);
    local_58._0_8_ = dVar18 + ((double)CONCAT44(0x43300000,(int)lVar11) - 4503599627370496.0);
    local_58._12_4_ = (int)((ulong)dVar18 >> 0x20);
  }
  *(undefined8 *)(auStack_288 + lVar2 + -8) = 0x102dd9;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Avg Aborts:",0xb);
  dVar18 = (double)local_58._0_8_ / (double)(int)(glb::numTrans * glb::N);
  *(undefined8 *)(auStack_288 + lVar2 + -8) = 0x102e02;
  poVar6 = std::ostream::_M_insert<double>(dVar18);
  uVar1 = *(undefined8 *)(*(long *)poVar6 + -0x18);
  *(undefined8 *)(auStack_288 + lVar2 + -8) = 0x102e19;
  std::ios::widen((char)uVar1 + (char)poVar6);
  *(undefined8 *)(auStack_288 + lVar2 + -8) = 0x102e24;
  std::ostream::put((char)poVar6);
  *(undefined8 *)(auStack_288 + lVar2 + -8) = 0x102e2c;
  std::ostream::flush();
  if (0 < (int)glb::N) {
    iVar10 = 0;
    do {
      foccCta = (FOCC_CTA *)0x0;
      if (DAT_0010c208._M_current == DAT_0010c210) {
        *(undefined8 *)(auStack_288 + lVar2 + -8) = 0x102e85;
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_realloc_insert<unsigned_long>
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&glb::total_aborts,
                   DAT_0010c208,(unsigned_long *)&foccCta);
      }
      else {
        *DAT_0010c208._M_current = 0;
        DAT_0010c208._M_current = DAT_0010c208._M_current + 1;
      }
      foccCta = (FOCC_CTA *)0x0;
      if (DAT_0010c220._M_current == DAT_0010c228) {
        *(undefined8 *)(auStack_288 + lVar2 + -8) = 0x102ebc;
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_realloc_insert<unsigned_long>
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&glb::total_delay,
                   DAT_0010c220,(unsigned_long *)&foccCta);
      }
      else {
        *DAT_0010c220._M_current = 0;
        DAT_0010c220._M_current = DAT_0010c220._M_current + 1;
      }
      iVar10 = iVar10 + 1;
    } while (iVar10 < (int)glb::N);
  }
  *(undefined8 *)(auStack_288 + lVar2 + -8) = 0x102ee0;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"\n***** BOCC CTA ******\n",0x17);
  *(undefined8 *)(auStack_288 + lVar2 + -8) = 0x102eea;
  this_02 = (BOCC_CTA *)operator_new(0x98);
  *(undefined8 *)(auStack_288 + lVar2 + -8) = 0x102efb;
  BOCC_CTA::BOCC_CTA(this_02,glb::M);
  foccCta = (FOCC_CTA *)this_02;
  *(undefined8 *)(auStack_288 + lVar2 + -8) = 0x102f12;
  glb::log_file = fopen("BOCC-CTA-log.txt","w");
  local_64 = 0;
  if (0 < (int)glb::N) {
    do {
      *(undefined8 *)(auStack_288 + lVar2 + -8) = 0x102f4d;
      std::thread::thread<void(&)(BOCC_CTA*,int),BOCC_CTA*&,int&,void>
                (&local_70,updtMem3,(BOCC_CTA **)&foccCta,&local_64);
      if (*(long *)(local_60 + (long)local_64 * 8) != 0) goto LAB_00103215;
      *(ulong *)(local_60 + (long)local_64 * 8) =
           CONCAT44(local_70._M_id._M_thread._4_4_,(int)local_70._M_id._M_thread);
      local_64 = local_64 + 1;
    } while (local_64 < (int)glb::N);
  }
  puVar3 = local_60;
  if (0 < (int)glb::N) {
    lVar11 = 0;
    do {
      *(undefined8 *)(auStack_288 + lVar2 + -8) = 0x102f90;
      std::thread::join();
      lVar11 = lVar11 + 1;
    } while (lVar11 < (int)glb::N);
  }
  this_00 = foccCta;
  if (foccCta != (FOCC_CTA *)0x0) {
    *(undefined8 *)(auStack_288 + lVar2 + -8) = 0x102fb4;
    BOCC_CTA::~BOCC_CTA((BOCC_CTA *)this_00);
    *(undefined8 *)(auStack_288 + lVar2 + -8) = 0x102fc1;
    operator_delete(this_00,0x98);
  }
  if (glb::total_delay == DAT_0010c220._M_current) {
    local_58 = ZEXT816(0);
  }
  else {
    lVar11 = 0;
    puVar8 = glb::total_delay;
    do {
      lVar11 = lVar11 + *puVar8;
      puVar8 = puVar8 + 1;
    } while (puVar8 != DAT_0010c220._M_current);
    auVar16._8_4_ = (int)((ulong)lVar11 >> 0x20);
    auVar16._0_8_ = lVar11;
    auVar16._12_4_ = 0x45300000;
    dVar18 = auVar16._8_8_ - 1.9342813113834067e+25;
    local_58._8_4_ = SUB84(dVar18,0);
    local_58._0_8_ = dVar18 + ((double)CONCAT44(0x43300000,(int)lVar11) - 4503599627370496.0);
    local_58._12_4_ = (int)((ulong)dVar18 >> 0x20);
  }
  *(undefined8 *)(auStack_288 + lVar2 + -8) = 0x10302b;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Avg Delay:",10);
  dVar18 = (double)local_58._0_8_ / (double)(int)(glb::numTrans * glb::N);
  *(undefined8 *)(auStack_288 + lVar2 + -8) = 0x103054;
  poVar6 = std::ostream::_M_insert<double>(dVar18);
  uVar1 = *(undefined8 *)(*(long *)poVar6 + -0x18);
  *(undefined8 *)(auStack_288 + lVar2 + -8) = 0x10306b;
  std::ios::widen((char)uVar1 + (char)poVar6);
  *(undefined8 *)(auStack_288 + lVar2 + -8) = 0x103076;
  std::ostream::put((char)poVar6);
  *(undefined8 *)(auStack_288 + lVar2 + -8) = 0x10307e;
  std::ostream::flush();
  if (glb::total_aborts == DAT_0010c208._M_current) {
    local_58 = ZEXT816(0);
  }
  else {
    lVar11 = 0;
    puVar8 = glb::total_aborts;
    do {
      lVar11 = lVar11 + *puVar8;
      puVar8 = puVar8 + 1;
    } while (puVar8 != DAT_0010c208._M_current);
    auVar17._8_4_ = (int)((ulong)lVar11 >> 0x20);
    auVar17._0_8_ = lVar11;
    auVar17._12_4_ = 0x45300000;
    dVar18 = auVar17._8_8_ - 1.9342813113834067e+25;
    local_58._8_4_ = SUB84(dVar18,0);
    local_58._0_8_ = dVar18 + ((double)CONCAT44(0x43300000,(int)lVar11) - 4503599627370496.0);
    local_58._12_4_ = (int)((ulong)dVar18 >> 0x20);
  }
  *(undefined8 *)(auStack_288 + lVar2 + -8) = 0x1030e8;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Avg Aborts:",0xb);
  dVar18 = (double)local_58._0_8_ / (double)(int)(glb::numTrans * glb::N);
  *(undefined8 *)(auStack_288 + lVar2 + -8) = 0x103111;
  poVar6 = std::ostream::_M_insert<double>(dVar18);
  uVar1 = *(undefined8 *)(*(long *)poVar6 + -0x18);
  *(undefined8 *)(auStack_288 + lVar2 + -8) = 0x103128;
  std::ios::widen((char)uVar1 + (char)poVar6);
  *(undefined8 *)(auStack_288 + lVar2 + -8) = 0x103133;
  std::ostream::put((char)poVar6);
  *(undefined8 *)(auStack_288 + lVar2 + -8) = 0x10313b;
  std::ostream::flush();
  if (uVar9 != 0) {
    lVar11 = uVar9 << 3;
    do {
      if (*(long *)(puVar3 + lVar11 + -8) != 0) {
LAB_00103215:
        *(code **)(auStack_288 + lVar2 + -8) = updtMem;
        std::terminate();
      }
      lVar11 = lVar11 + -8;
    } while (lVar11 != 0);
  }
  *(undefined8 *)(local_78 + -8) = 0x103166;
  std::ifstream::~ifstream(&local_280);
  return 0;
}

Assistant:

int main() {
    srand(time(nullptr));

    std::ifstream inFile{"inp-params.txt", std::ifstream::in};
    if(inFile.fail()){
        std::cerr<<"inp-params.txt NOT FOUND!\n";
        exit(1);
    }
    inFile>>glb::N>>glb::M>>glb::numTrans>>glb::constVal>>glb::lambda;

    // initialization.
    for(int i=0; i<glb::N; i++) {
        glb::total_aborts.push_back(0);
        glb::total_delay.push_back(0);
    }

    std::cout<<"Input Params: N="<<glb::N<<" M = "<<glb::M<<" numTrans = "<<glb::numTrans<<"\n";

    glb::dist = std::exponential_distribution<double>(glb::lambda);

    // -- FOCC OTA ----
    std::cout<<"***** FOCC OTA ******\n";
    glb::foccOta = new FOCC_OTA(glb::M);

    std::thread tids[glb::N];

    glb::log_file = fopen("FOCC-OTA-log.txt", "w");
    for(int i=0; i<glb::N; i++) tids[i] =  std::thread(updtMem, glb::foccOta,i);
    for(int i=0; i<glb::N; i++) tids[i].join();
    delete glb::foccOta;

    uint64_t res = 0;
    for(auto e: glb::total_delay) res+=e;
    std::cout<<"Avg Delay:"<<(((double)res)/(glb::N*glb::numTrans))<<std::endl;
    res = 0;
    for(auto e: glb::total_aborts) res+=e;
    //std::cout<<"tota bors: "<<res<<"\n";
    std::cout<<"Avg Aborts:"<<(((double)res)/(glb::N*glb::numTrans))<<std::endl;
    fclose(glb::log_file);


    // -- FOCC CTA ----
    for(int i=0; i<glb::N; i++) {
        glb::total_aborts.push_back(0);
        glb::total_delay.push_back(0);
    }

    std::cout<<"\n***** FOCC CTA ******\n";

    FOCC_CTA * foccCta = new FOCC_CTA(glb::M);


    glb::log_file = fopen("FOCC-CTA-log.txt", "w");
    for(int i=0; i<glb::N; i++) tids[i] =  std::thread(updtMem2, foccCta,i);
    for(int i=0; i<glb::N; i++) tids[i].join();

    delete foccCta;

    res = 0;
    for(auto e: glb::total_delay) res+=e;
    std::cout<<"Avg Delay:"<<(((double)res)/(glb::N*glb::numTrans))<<std::endl;
    res = 0;
    for(auto e: glb::total_aborts) res+=e;
    //std::cout<<"tota bors: "<<res<<"\n";
    std::cout<<"Avg Aborts:"<<(((double)res)/(glb::N*glb::numTrans))<<std::endl;

    // -- FOCC CTA ----
    for(int i=0; i<glb::N; i++) {
        glb::total_aborts.push_back(0);
        glb::total_delay.push_back(0);
    }

    std::cout<<"\n***** BOCC CTA ******\n";

    BOCC_CTA * boccCta = new BOCC_CTA(glb::M);


    glb::log_file = fopen("BOCC-CTA-log.txt", "w");
    for(int i=0; i<glb::N; i++) tids[i] =  std::thread(updtMem3, boccCta,i);
    for(int i=0; i<glb::N; i++) tids[i].join();

    delete boccCta;

    res = 0;
    for(auto e: glb::total_delay) res+=e;
    std::cout<<"Avg Delay:"<<(((double)res)/(glb::N*glb::numTrans))<<std::endl;
    res = 0;
    for(auto e: glb::total_aborts) res+=e;
    //std::cout<<"tota bors: "<<res<<"\n";
    std::cout<<"Avg Aborts:"<<(((double)res)/(glb::N*glb::numTrans))<<std::endl;

    return 0;
}